

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmArraySetup(ExpressionContext *ctx,VmModule *module,ExprArraySetup *node)

{
  SynBase *pSVar1;
  VmInstruction *pVVar2;
  SynBase *pSVar3;
  InplaceStr name;
  VmBlock *pVVar4;
  TypeBase *ptr;
  ExprArraySetup *pEVar5;
  VmModule *pVVar6;
  bool bVar7;
  VmConstant *pVVar8;
  VmValue *pVVar9;
  VmValue *pVVar10;
  TypeRef *pTVar11;
  InplaceStr local_90;
  VmValue *local_80;
  VmValue *offset;
  VmValue *condition;
  VmBlock *exitBlock;
  VmBlock *bodyBlock;
  VmBlock *conditionBlock;
  VmValue *offsetPtr;
  TypeBase *elementType;
  VmValue *address;
  VmValue *initializer;
  TypeArray *arrayType;
  TypeRef *refType;
  ExprArraySetup *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  refType = (TypeRef *)node;
  node_local = (ExprArraySetup *)module;
  module_local = (VmModule *)ctx;
  arrayType = (TypeArray *)getType<TypeRef>(node->lhs->type);
  if (arrayType == (TypeArray *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xdb8,
                  "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)")
    ;
  }
  initializer = (VmValue *)getType<TypeArray>(arrayType->subType);
  if (initializer != (VmValue *)0x0) {
    address = CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
                        *(ExprBase **)&(refType->super_TypeBase).padding);
    elementType = (TypeBase *)
                  CompileVm((ExpressionContext *)module_local,(VmModule *)node_local,
                            (ExprBase *)(refType->super_TypeBase).size);
    offsetPtr = (initializer->users).little[2];
    bVar7 = isType<TypeBool>((TypeBase *)offsetPtr);
    if ((((!bVar7) && (bVar7 = isType<TypeChar>((TypeBase *)offsetPtr), !bVar7)) &&
        (bVar7 = isType<TypeShort>((TypeBase *)offsetPtr), !bVar7)) &&
       (((bVar7 = isType<TypeInt>((TypeBase *)offsetPtr), !bVar7 &&
         (bVar7 = isType<TypeLong>((TypeBase *)offsetPtr), !bVar7)) &&
        ((bVar7 = isType<TypeFloat>((TypeBase *)offsetPtr), !bVar7 &&
         (bVar7 = isType<TypeDouble>((TypeBase *)offsetPtr), !bVar7)))))) {
      conditionBlock =
           (VmBlock *)
           anon_unknown.dwarf_aa461::CreateAlloca
                     ((ExpressionContext *)module_local,(VmModule *)node_local,
                      (SynBase *)(refType->super_TypeBase).name.begin,
                      (TypeBase *)module_local[6].loadStoreInfo.little[0xe].storeInst,"arr_it",true)
      ;
      bodyBlock = anon_unknown.dwarf_aa461::CreateBlock
                            ((VmModule *)node_local,(SynBase *)(refType->super_TypeBase).name.begin,
                             "arr_setup_cond");
      exitBlock = anon_unknown.dwarf_aa461::CreateBlock
                            ((VmModule *)node_local,(SynBase *)(refType->super_TypeBase).name.begin,
                             "arr_setup_body");
      condition = &anon_unknown.dwarf_aa461::CreateBlock
                             ((VmModule *)node_local,(SynBase *)(refType->super_TypeBase).name.begin
                              ,"arr_setup_exit")->super_VmValue;
      pVVar6 = module_local;
      pEVar5 = node_local;
      pVVar4 = conditionBlock;
      pSVar1 = (SynBase *)(refType->super_TypeBase).name.begin;
      pVVar2 = module_local[6].loadStoreInfo.little[0xe].storeInst;
      pVVar8 = CreateConstantInt((Allocator *)node_local[0x56].initializer,
                                 (SynBase *)(refType->super_TypeBase).name.begin,0);
      anon_unknown.dwarf_aa461::CreateStore
                ((ExpressionContext *)pVVar6,(VmModule *)pEVar5,pSVar1,(TypeBase *)pVVar2,
                 &pVVar4->super_VmValue,&pVVar8->super_VmValue,0);
      anon_unknown.dwarf_aa461::CreateJump
                ((VmModule *)node_local,(SynBase *)(refType->super_TypeBase).name.begin,
                 &bodyBlock->super_VmValue);
      VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,bodyBlock);
      pEVar5 = node_local;
      node_local->lhs = (ExprBase *)bodyBlock;
      if ((long)((int)(initializer->users).little[3] *
                (int)((initializer->users).little[2]->comment).end) ==
          (long)(initializer->users).little[3] * (long)((initializer->users).little[2]->comment).end
         ) {
        pSVar1 = (SynBase *)(refType->super_TypeBase).name.begin;
        pVVar9 = anon_unknown.dwarf_aa461::CreateLoad
                           ((ExpressionContext *)module_local,(VmModule *)node_local,
                            (SynBase *)(refType->super_TypeBase).name.begin,
                            (TypeBase *)module_local[6].loadStoreInfo.little[0xe].storeInst,
                            &conditionBlock->super_VmValue,0);
        pVVar8 = CreateConstantInt((Allocator *)node_local[0x56].initializer,
                                   (SynBase *)(refType->super_TypeBase).name.begin,
                                   (int)(initializer->users).little[3] *
                                   (int)((initializer->users).little[2]->comment).end);
        offset = anon_unknown.dwarf_aa461::CreateCompareLess
                           ((VmModule *)pEVar5,pSVar1,pVVar9,&pVVar8->super_VmValue);
        anon_unknown.dwarf_aa461::CreateJumpNotZero
                  ((VmModule *)node_local,(SynBase *)(refType->super_TypeBase).name.begin,offset,
                   &exitBlock->super_VmValue,condition);
        VmFunction::AddBlock(*(VmFunction **)&(node_local->super_ExprBase).listed,exitBlock);
        node_local->lhs = (ExprBase *)exitBlock;
        pVVar10 = anon_unknown.dwarf_aa461::CreateLoad
                            ((ExpressionContext *)module_local,(VmModule *)node_local,
                             (SynBase *)(refType->super_TypeBase).name.begin,
                             (TypeBase *)module_local[6].loadStoreInfo.little[0xe].storeInst,
                             &conditionBlock->super_VmValue,0);
        pVVar6 = module_local;
        pEVar5 = node_local;
        ptr = elementType;
        pSVar1 = (SynBase *)(refType->super_TypeBase).name.begin;
        pVVar9 = (initializer->users).little[2];
        pSVar3 = (SynBase *)(refType->super_TypeBase).name.begin;
        local_80 = pVVar10;
        pTVar11 = ExpressionContext::GetReferenceType
                            ((ExpressionContext *)module_local,
                             (TypeBase *)(initializer->users).little[2]);
        InplaceStr::InplaceStr(&local_90);
        name.end = local_90.end;
        name.begin = local_90.begin;
        pVVar10 = anon_unknown.dwarf_aa461::CreateMemberAccess
                            ((VmModule *)pEVar5,pSVar3,(VmValue *)ptr,pVVar10,
                             &pTVar11->super_TypeBase,name);
        anon_unknown.dwarf_aa461::CreateStore
                  ((ExpressionContext *)pVVar6,(VmModule *)pEVar5,pSVar1,(TypeBase *)pVVar9,pVVar10,
                   address,0);
        pVVar6 = module_local;
        pEVar5 = node_local;
        pVVar4 = conditionBlock;
        pVVar9 = local_80;
        pSVar1 = (SynBase *)(refType->super_TypeBase).name.begin;
        pVVar2 = module_local[6].loadStoreInfo.little[0xe].storeInst;
        pSVar3 = (SynBase *)(refType->super_TypeBase).name.begin;
        pVVar8 = CreateConstantInt((Allocator *)node_local[0x56].initializer,
                                   (SynBase *)(refType->super_TypeBase).name.begin,
                                   (int)((initializer->users).little[2]->comment).end);
        pVVar9 = anon_unknown.dwarf_aa461::CreateAdd
                           ((VmModule *)pEVar5,pSVar3,pVVar9,&pVVar8->super_VmValue);
        anon_unknown.dwarf_aa461::CreateStore
                  ((ExpressionContext *)pVVar6,(VmModule *)pEVar5,pSVar1,(TypeBase *)pVVar2,
                   &pVVar4->super_VmValue,pVVar9,0);
        anon_unknown.dwarf_aa461::CreateJump
                  ((VmModule *)node_local,(SynBase *)(refType->super_TypeBase).name.begin,
                   &bodyBlock->super_VmValue);
        VmFunction::AddBlock
                  (*(VmFunction **)&(node_local->super_ExprBase).listed,(VmBlock *)condition);
        pVVar6 = module_local;
        pTVar11 = refType;
        node_local->lhs = (ExprBase *)condition;
        pVVar9 = anon_unknown.dwarf_aa461::CreateVoid((VmModule *)node_local);
        pVVar9 = anon_unknown.dwarf_aa461::CheckType
                           ((ExpressionContext *)pVVar6,(ExprBase *)pTVar11,pVVar9);
        return pVVar9;
      }
      __assert_fail("int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xdd6,
                    "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)"
                   );
    }
    pVVar6 = module_local;
    pTVar11 = refType;
    pVVar9 = anon_unknown.dwarf_aa461::CreateSetRange
                       ((VmModule *)node_local,(SynBase *)(refType->super_TypeBase).name.begin,
                        (VmValue *)elementType,(int)(initializer->users).little[3],address,
                        (int)(offsetPtr->comment).end);
    pVVar9 = anon_unknown.dwarf_aa461::CheckType
                       ((ExpressionContext *)pVVar6,(ExprBase *)pTVar11,pVVar9);
    return pVVar9;
  }
  __assert_fail("arrayType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xdbc,
                "VmValue *CompileVmArraySetup(ExpressionContext &, VmModule *, ExprArraySetup *)");
}

Assistant:

VmValue* CompileVmArraySetup(ExpressionContext &ctx, VmModule *module, ExprArraySetup *node)
{
	TypeRef *refType = getType<TypeRef>(node->lhs->type);

	assert(refType);

	TypeArray *arrayType = getType<TypeArray>(refType->subType);

	assert(arrayType);

	VmValue *initializer = CompileVm(ctx, module, node->initializer);

	VmValue *address = CompileVm(ctx, module, node->lhs);

	TypeBase *elementType = arrayType->subType;

	// Fast memset for supported types
	if(isType<TypeBool>(elementType) || isType<TypeChar>(elementType) || isType<TypeShort>(elementType) || isType<TypeInt>(elementType) || isType<TypeLong>(elementType) || isType<TypeFloat>(elementType) || isType<TypeDouble>(elementType))
		return CheckType(ctx, node, CreateSetRange(module, node->source, address, int(arrayType->length), initializer, int(elementType->size)));

	VmValue *offsetPtr = CreateAlloca(ctx, module, node->source, ctx.typeInt, "arr_it", true);

	VmBlock *conditionBlock = CreateBlock(module, node->source, "arr_setup_cond");
	VmBlock *bodyBlock = CreateBlock(module, node->source, "arr_setup_body");
	VmBlock *exitBlock = CreateBlock(module, node->source, "arr_setup_exit");

	CreateStore(ctx, module, node->source, ctx.typeInt, offsetPtr, CreateConstantInt(module->allocator, node->source, 0), 0);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(conditionBlock);
	module->currentBlock = conditionBlock;

	// Offset will move in element size steps, so it will reach the full size of the array
	assert(int(arrayType->length * arrayType->subType->size) == arrayType->length * arrayType->subType->size);

	// While offset is less than array size
	VmValue* condition = CreateCompareLess(module, node->source, CreateLoad(ctx, module, node->source, ctx.typeInt, offsetPtr, 0), CreateConstantInt(module->allocator, node->source, int(arrayType->length * arrayType->subType->size)));

	CreateJumpNotZero(module, node->source, condition, bodyBlock, exitBlock);

	module->currentFunction->AddBlock(bodyBlock);
	module->currentBlock = bodyBlock;

	VmValue *offset = CreateLoad(ctx, module, node->source, ctx.typeInt, offsetPtr, 0);

	CreateStore(ctx, module, node->source, arrayType->subType, CreateMemberAccess(module, node->source, address, offset, ctx.GetReferenceType(arrayType->subType), InplaceStr()), initializer, 0);
	CreateStore(ctx, module, node->source, ctx.typeInt, offsetPtr, CreateAdd(module, node->source, offset, CreateConstantInt(module->allocator, node->source, int(arrayType->subType->size))), 0);

	CreateJump(module, node->source, conditionBlock);

	module->currentFunction->AddBlock(exitBlock);
	module->currentBlock = exitBlock;

	return CheckType(ctx, node, CreateVoid(module));
}